

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int reserve_ds(flatcc_builder_t *B,size_t need,flatbuffers_uoffset_t limit)

{
  int iVar1;
  flatcc_iovec_t *buf;
  flatbuffers_uoffset_t limit_local;
  size_t need_local;
  flatcc_builder_t *B_local;
  
  iVar1 = (*B->alloc)(B->alloc_context,B->buffers + 1,B->ds_first + need,1,1);
  if (iVar1 == 0) {
    refresh_ds(B,limit);
    B_local._4_4_ = 0;
  }
  else {
    B_local._4_4_ = -1;
  }
  return B_local._4_4_;
}

Assistant:

static int reserve_ds(flatcc_builder_t *B, size_t need, uoffset_t limit)
{
    iovec_t *buf = B->buffers + flatcc_builder_alloc_ds;

    if (B->alloc(B->alloc_context, buf, B->ds_first + need, 1, flatcc_builder_alloc_ds)) {
        return -1;
    }
    refresh_ds(B, limit);
    return 0;
}